

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Line_SetTextureScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  side_t *psVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  FLineIdIterator itr;
  FLineIdIterator local_38;
  
  iVar3 = 0;
  if ((uint)arg3 < 2 && arg0 != 0) {
    local_38.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
    local_38.searchtag = arg0;
    uVar4 = FLineIdIterator::Next(&local_38);
    if (-1 < (int)uVar4) {
      dVar6 = (double)arg1 * 1.52587890625e-05;
      dVar7 = (double)arg2 * 1.52587890625e-05;
      dVar2 = (double)(~-(ulong)(dVar6 == 0.0) & (ulong)dVar6 |
                      -(ulong)(dVar6 == 0.0) & 0x3ff0000000000000);
      dVar8 = (double)(~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 |
                      -(ulong)(dVar7 == 0.0) & 0x3ff0000000000000);
      do {
        psVar1 = lines[uVar4].sidedef[(uint)arg3];
        if (psVar1 != (side_t *)0x0) {
          if ((arg4 & 8U) == 0) {
            if (arg1 != 0x7fff0000) {
              if ((arg4 & 1U) != 0) {
                psVar1->textures[0].xScale = dVar2;
              }
              if ((arg4 & 2U) != 0) {
                psVar1->textures[1].xScale = dVar2;
              }
              if ((arg4 & 4U) != 0) {
                psVar1->textures[2].xScale = dVar2;
              }
            }
            if (arg2 != 0x7fff0000) {
              if ((arg4 & 1U) != 0) {
                psVar1->textures[0].yScale = dVar8;
              }
              if ((arg4 & 2U) != 0) {
                psVar1->textures[1].yScale = dVar8;
              }
              dVar5 = dVar8;
              if ((arg4 & 4U) != 0) {
LAB_00506b54:
                psVar1->textures[2].yScale = dVar5;
              }
            }
          }
          else {
            if (arg1 != 0x7fff0000) {
              if ((arg4 & 1U) != 0) {
                psVar1->textures[0].xScale = psVar1->textures[0].xScale * dVar6;
              }
              if ((arg4 & 2U) != 0) {
                psVar1->textures[1].xScale = psVar1->textures[1].xScale * dVar6;
              }
              if ((arg4 & 4U) != 0) {
                psVar1->textures[2].xScale = psVar1->textures[2].xScale * dVar6;
              }
            }
            if (arg2 != 0x7fff0000) {
              if ((arg4 & 1U) != 0) {
                psVar1->textures[0].yScale = psVar1->textures[0].yScale * dVar7;
              }
              if ((arg4 & 2U) != 0) {
                psVar1->textures[1].yScale = psVar1->textures[1].yScale * dVar7;
              }
              if ((arg4 & 4U) != 0) {
                dVar5 = psVar1->textures[2].yScale * dVar7;
                goto LAB_00506b54;
              }
            }
          }
        }
        uVar4 = FLineIdIterator::Next(&local_38);
      } while (-1 < (int)uVar4);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

FUNC(LS_Line_SetTextureScale)
// Line_SetTextureScale (id, x, y, side, flags)
{
	const int NO_CHANGE = 32767 << 16;
	double farg1 = arg1 / 65536.;
	double farg2 = arg2 / 65536.;

	if (arg0 == 0 || arg3 < 0 || arg3 > 1)
		return false;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		side_t *side = lines[line].sidedef[arg3];
		if (side != NULL)
		{
			if ((arg4&8)==0)
			{
				// set
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureXScale(side_t::top, farg1);
					if (arg4&2) side->SetTextureXScale(side_t::mid, farg1);
					if (arg4&4) side->SetTextureXScale(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureYScale(side_t::top, farg2);
					if (arg4&2) side->SetTextureYScale(side_t::mid, farg2);
					if (arg4&4) side->SetTextureYScale(side_t::bottom, farg2);
				}
			}
			else
			{
				// add
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->MultiplyTextureXScale(side_t::top, farg1);
					if (arg4&2) side->MultiplyTextureXScale(side_t::mid, farg1);
					if (arg4&4) side->MultiplyTextureXScale(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->MultiplyTextureYScale(side_t::top, farg2);
					if (arg4&2) side->MultiplyTextureYScale(side_t::mid, farg2);
					if (arg4&4) side->MultiplyTextureYScale(side_t::bottom, farg2);
				}
			}
		}
	}
	return true;
}